

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase
          (iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,iterator pos)

{
  value_type *this_00;
  iterator it;
  Node *pNVar1;
  InnerMap *pIVar2;
  size_type sVar3;
  iterator i;
  
  if ((this->arena_ == (Arena *)0x0) &&
     (this_00 = ((pos.it_.node_)->kv).v_, this_00 != (value_type *)0x0)) {
    MapKey::~MapKey(&this_00->first);
    operator_delete(this_00,0x20);
  }
  sVar3 = pos.it_.bucket_index_;
  pIVar2 = pos.it_.m_;
  pNVar1 = pos.it_.node_;
  InnerMap::
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::operator++(&pos.it_);
  it.m_ = pIVar2;
  it.node_ = pNVar1;
  it.bucket_index_ = sVar3;
  InnerMap::erase(this->elements_,it);
  (__return_storage_ptr__->it_).bucket_index_ = pos.it_.bucket_index_;
  (__return_storage_ptr__->it_).node_ = pos.it_.node_;
  (__return_storage_ptr__->it_).m_ = pos.it_.m_;
  return __return_storage_ptr__;
}

Assistant:

iterator erase(iterator pos) {
    if (arena_ == NULL) delete pos.operator->();
    iterator i = pos++;
    elements_->erase(i.it_);
    return pos;
  }